

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  ChunkHeader *pCVar1;
  void *pvVar2;
  ulong size;
  ulong uVar3;
  ulong __n;
  
  if (originalPtr == (void *)0x0) {
    pvVar2 = Malloc(this,newSize);
    return pvVar2;
  }
  if (newSize != 0) {
    __n = originalSize + 7 & 0xfffffffffffffff8;
    size = newSize + 7 & 0xfffffffffffffff8;
    if (size < __n || size - __n == 0) {
      return originalPtr;
    }
    pCVar1 = this->shared_->chunkHead;
    if (((void *)((long)pCVar1 + (pCVar1->size - __n) + 0x18) == originalPtr) &&
       (uVar3 = pCVar1->size + (size - __n), uVar3 <= pCVar1->capacity)) {
      pCVar1->size = uVar3;
      return originalPtr;
    }
    pvVar2 = Malloc(this,size);
    if (pvVar2 != (void *)0x0) {
      if (__n == 0) {
        return pvVar2;
      }
      pvVar2 = memcpy(pvVar2,originalPtr,__n);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (newSize == 0)
            return NULL;

        originalSize = RAPIDJSON_ALIGN(originalSize);
        newSize = RAPIDJSON_ALIGN(newSize);

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == GetChunkBuffer(shared_) + shared_->chunkHead->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            if (shared_->chunkHead->size + increment <= shared_->chunkHead->capacity) {
                shared_->chunkHead->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        if (void* newBuffer = Malloc(newSize)) {
            if (originalSize)
                std::memcpy(newBuffer, originalPtr, originalSize);
            return newBuffer;
        }
        else
            return NULL;
    }